

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.hpp
# Opt level: O0

void __thiscall
Kernel::BooleanSubtermIt::BooleanSubtermIt(BooleanSubtermIt *this,Term *term,bool includeSelf)

{
  bool bVar1;
  Term *this_00;
  Term *in_RSI;
  IteratorCore<Kernel::TermList> *in_RDI;
  TermList t1;
  TermList t0;
  Term *in_stack_ffffffffffffff88;
  Term *elem;
  Stack<Kernel::Term_*> *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  Stack<Kernel::Term_*> *in_stack_ffffffffffffffa0;
  
  Lib::IteratorCore<Kernel::TermList>::IteratorCore(in_RDI);
  in_RDI->_vptr_IteratorCore = (_func_int **)&PTR__BooleanSubtermIt_01320618;
  in_RDI->field_0xc = 1;
  TermList::TermList((TermList *)(in_RDI + 1));
  Lib::Stack<Kernel::Term_*>::Stack
            (in_stack_ffffffffffffffa0,CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98)
            );
  bVar1 = Term::isLiteral((Term *)0x78d1fb);
  if (bVar1) {
    Term::nthArgument(in_RSI,0);
    Term::nthArgument(in_RSI,1);
    bVar1 = TermList::isVar((TermList *)in_stack_ffffffffffffff90);
    if (!bVar1) {
      TermList::term((TermList *)0x78d26b);
      Lib::Stack<Kernel::Term_*>::push(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    bVar1 = TermList::isVar((TermList *)in_stack_ffffffffffffff90);
    if (!bVar1) {
      elem = (Term *)&in_RDI[1]._refCnt;
      this_00 = TermList::term((TermList *)0x78d2e3);
      Lib::Stack<Kernel::Term_*>::push((Stack<Kernel::Term_*> *)this_00,elem);
    }
  }
  else {
    Lib::Stack<Kernel::Term_*>::push(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  return;
}

Assistant:

BooleanSubtermIt(Term* term, bool includeSelf=false) 
  : _used(true), _stack(8)
  {
    if(term->isLiteral()){
      TermList t0 = *term->nthArgument(0);
      TermList t1 = *term->nthArgument(1);
      if(!t0.isVar()){ _stack.push(t0.term()); }
      if(!t1.isVar()){ _stack.push(t1.term()); }      
      return;      
    } 
    _stack.push(term);
  }